

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Teleport_ZombieChanger
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  FState *newstate;
  int iVar1;
  FName local_14;
  
  if (it == (AActor *)0x0) {
    iVar1 = 0;
  }
  else {
    EV_Teleport(arg0,arg1,ln,(uint)backSide,it,0);
    iVar1 = 1;
    if (-1 < it->health) {
      newstate = AActor::FindState(it,&local_14);
      AActor::SetState(it,newstate,false);
    }
  }
  return iVar1;
}

Assistant:

FUNC(LS_Teleport_ZombieChanger)
// Teleport_ZombieChanger (tid, sectortag)
{
	// This is practically useless outside of Strife, but oh well.
	if (it != NULL)
	{
		EV_Teleport (arg0, arg1, ln, backSide, it, 0);
		if (it->health >= 0) it->SetState (it->FindState(NAME_Pain));
		return true;
	}
	return false;
}